

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cc
# Opt level: O0

undefined8
mem_string_abi_cxx11_
          (MemoryStatus *mem_status,MEMORY_MODE mode,bool use_colors,bool use_powerline_left,
          bool use_powerline_right)

{
  undefined4 uVar1;
  ostream *poVar2;
  byte in_CL;
  int in_EDX;
  float *in_RSI;
  undefined8 in_RDI;
  byte in_R8B;
  byte in_R9B;
  float percentage_mem;
  float free_mem_in_gigabytes;
  float free_mem;
  uint color;
  ostringstream oss;
  undefined8 in_stack_fffffffffffffdb8;
  ios_base *in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffe53;
  float in_stack_fffffffffffffe54;
  float in_stack_fffffffffffffe58;
  float in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe64;
  long local_190 [47];
  byte local_17;
  byte local_16;
  byte local_15;
  int local_14;
  float *local_10;
  
  local_15 = in_CL & 1;
  local_16 = in_R8B & 1;
  local_17 = in_R9B & 1;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::ios_base::precision((ios_base *)((long)local_190 + *(long *)(local_190[0] + -0x18)),2);
  std::operator|(_S_fixed,_S_right);
  std::ios_base::setf(in_stack_fffffffffffffdc0,(fmtflags)((ulong)in_stack_fffffffffffffdb8 >> 0x20)
                     );
  uVar1 = (undefined4)(long)((*local_10 * 100.0) / local_10[1]);
  if ((local_15 & 1) != 0) {
    if ((local_17 & 1) == 0) {
      if ((local_16 & 1) == 0) {
        powerline((ostringstream *)CONCAT44(in_stack_fffffffffffffe64,uVar1),
                  (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                  (POWERLINE_DIRECTION)in_stack_fffffffffffffe54,(bool)in_stack_fffffffffffffe53);
      }
      else {
        powerline((ostringstream *)CONCAT44(in_stack_fffffffffffffe64,uVar1),
                  (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                  (POWERLINE_DIRECTION)in_stack_fffffffffffffe54,(bool)in_stack_fffffffffffffe53);
        std::operator<<((ostream *)local_190,' ');
      }
    }
    else {
      std::operator<<((ostream *)local_190,"#[bg=default]");
      powerline((ostringstream *)CONCAT44(in_stack_fffffffffffffe64,uVar1),
                (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                (POWERLINE_DIRECTION)in_stack_fffffffffffffe54,(bool)in_stack_fffffffffffffe53);
      std::operator<<((ostream *)local_190,' ');
    }
  }
  if (local_14 == 1) {
    in_stack_fffffffffffffe5c = local_10[1] - *local_10;
    in_stack_fffffffffffffe58 = convert_unit<float>(in_stack_fffffffffffffe5c,3,2);
    if (1.0 <= in_stack_fffffffffffffe58) {
      poVar2 = (ostream *)std::ostream::operator<<(local_190,in_stack_fffffffffffffe58);
      std::operator<<(poVar2,"GB");
    }
    else {
      poVar2 = (ostream *)std::ostream::operator<<(local_190,in_stack_fffffffffffffe5c);
      std::operator<<(poVar2,"MB");
    }
  }
  else if (local_14 == 2) {
    in_stack_fffffffffffffe54 = (*local_10 / local_10[1]) * 100.0;
    poVar2 = (ostream *)std::ostream::operator<<(local_190,in_stack_fffffffffffffe54);
    std::operator<<(poVar2,'%');
  }
  else if ((*local_10 <= 10000.0) || (local_10[1] <= 10000.0)) {
    if ((10000.0 < *local_10 || *local_10 == 10000.0) || (local_10[1] <= 10000.0)) {
      poVar2 = (ostream *)std::ostream::operator<<(local_190,(uint)(long)*local_10);
      poVar2 = std::operator<<(poVar2,"/");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)(long)local_10[1]);
      std::operator<<(poVar2,"MB");
    }
    else {
      poVar2 = (ostream *)std::ostream::operator<<(local_190,(uint)(long)*local_10);
      poVar2 = std::operator<<(poVar2,"MB/");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)(long)(local_10[1] * 0.0009765625));
      std::operator<<(poVar2,"GB");
    }
  }
  else {
    poVar2 = (ostream *)std::ostream::operator<<(local_190,(uint)(long)(*local_10 * 0.0009765625));
    poVar2 = std::operator<<(poVar2,"/");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)(long)(local_10[1] * 0.0009765625));
    std::operator<<(poVar2,"GB");
  }
  if ((local_15 & 1) != 0) {
    if ((local_16 & 1) == 0) {
      if ((local_17 & 1) == 0) {
        std::operator<<((ostream *)local_190,"#[fg=default,bg=default]");
      }
    }
    else {
      powerline((ostringstream *)CONCAT44(in_stack_fffffffffffffe64,uVar1),
                (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                (POWERLINE_DIRECTION)in_stack_fffffffffffffe54,(bool)in_stack_fffffffffffffe53);
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return in_RDI;
}

Assistant:

std::string mem_string( const MemoryStatus & mem_status,
  MEMORY_MODE mode,
  bool use_colors,
  bool use_powerline_left,
  bool use_powerline_right )
{
  std::ostringstream oss;
  // Change the percision for floats, for a pretty output
  oss.precision( 2 );
  oss.setf( std::ios::fixed | std::ios::right );

  unsigned int color = static_cast< unsigned int >((100 * mem_status.used_mem) / mem_status.total_mem);
  if( use_colors )
  {
    if( use_powerline_right )
    {
      oss << "#[bg=default]";
      powerline( oss, mem_lut[color], POWERLINE_RIGHT );
      oss << ' ';
    }
    else if( use_powerline_left )
    {
      //powerline( oss, mem_lut[color], POWERLINE_LEFT );
      // We do not know how to invert the default background color
      powerline( oss, mem_lut[color], NONE );
      oss << ' ';
    }
    else
    {
      powerline( oss, mem_lut[color], NONE );
    }
  }

  switch( mode )
  {
  case MEMORY_MODE_FREE_MEMORY: // Show free memory in MB or GB
    {
    const float free_mem = mem_status.total_mem - mem_status.used_mem;
    const float free_mem_in_gigabytes = convert_unit( free_mem, GIGABYTES, MEGABYTES );

    // if free memory is less than 1 GB, use MB instead
    if(  free_mem_in_gigabytes < 1.0f )
    {
      oss << free_mem << "MB";
    }
    else
    {
      oss << free_mem_in_gigabytes << "GB";
    }
    break;
    }
  case MEMORY_MODE_USAGE_PERCENTAGE:
    {
    // Calculate the percentage of used memory
    const float percentage_mem = mem_status.used_mem /
      static_cast<float>( mem_status.total_mem ) * 100.0;

    oss << percentage_mem << '%';
    break;
    }
  default: // Default mode, just show the used/total memory in MB
    if(mem_status.used_mem>10000 && mem_status.total_mem>10000)
      oss<<static_cast<unsigned int>(mem_status.used_mem/1024)<<"/"<<static_cast<unsigned int>(mem_status.total_mem/1024)<<"GB";
    else if(mem_status.used_mem<10000 && mem_status.total_mem>10000)
      oss<<static_cast<unsigned int>(mem_status.used_mem)<<"MB/"<<static_cast<unsigned int>(mem_status.total_mem/1024)<<"GB";
    else
      oss<<static_cast<unsigned int>(mem_status.used_mem)<<"/"<<static_cast<unsigned int>(mem_status.total_mem)<<"MB";
  }

  if( use_colors )
  {
    if( use_powerline_left )
    {
      powerline( oss, mem_lut[color], POWERLINE_LEFT, true );
    }
    else if( !use_powerline_right )
    {
      oss << "#[fg=default,bg=default]";
    }
  }

  return oss.str();
}